

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O3

void CB_ADF::output_example(vw *all,cb_adf *c,example *ec,multi_ex *ec_seq)

{
  v_array<char> *pvVar1;
  int iVar2;
  int *piVar3;
  wclass *pwVar4;
  _func_void_int_string_v_array<char> *p_Var5;
  v_array<char> vVar6;
  byte bVar7;
  bool bVar8;
  ostream *poVar9;
  float *pfVar10;
  int *piVar11;
  long lVar12;
  long lVar13;
  float fVar14;
  string outputString;
  stringstream outputStringStream;
  undefined6 in_stack_fffffffffffffde8;
  char in_stack_fffffffffffffdee;
  vw *pvVar15;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  if ((((ec->tag)._end != (ec->tag)._begin) ||
      ((ec->super_example_predict).indices._end != (ec->super_example_predict).indices._begin)) ||
     (bVar8 = CB::ec_is_example_header(ec), bVar8)) {
    pvVar1 = &ec->tag;
    bVar7 = update_statistics(all,c,ec,ec_seq);
    piVar11 = (all->final_prediction_sink)._begin;
    piVar3 = (all->final_prediction_sink)._end;
    if (piVar11 != piVar3) {
      fVar14 = (float)((ec->pred).a_s._begin)->action;
      do {
        (*all->print)(*piVar11,fVar14,0.0,*pvVar1);
        piVar11 = piVar11 + 1;
      } while (piVar11 != piVar3);
    }
    if (0 < all->raw_prediction) {
      local_1f8 = local_1e8;
      local_1f0 = 0;
      local_1e8[0] = 0;
      std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_1f8,_S_out|_S_in);
      pwVar4 = (ec->l).cs.costs._begin;
      lVar12 = (long)(ec->l).cs.costs._end - (long)pwVar4;
      if (lVar12 != 0) {
        lVar12 = lVar12 >> 4;
        pfVar10 = &pwVar4->wap_value;
        lVar13 = 0;
        do {
          if (lVar13 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,&stack0xfffffffffffffdee,1);
          }
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          in_stack_fffffffffffffdee = ':';
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,&stack0xfffffffffffffdee,1);
          std::ostream::_M_insert<double>((double)*pfVar10);
          lVar13 = lVar13 + 1;
          pfVar10 = pfVar10 + 4;
        } while (lVar12 + (ulong)(lVar12 == 0) != lVar13);
      }
      p_Var5 = all->print_text;
      iVar2 = all->raw_prediction;
      pvVar15 = all;
      std::__cxx11::stringbuf::str();
      vVar6._begin._6_1_ = in_stack_fffffffffffffdee;
      vVar6._begin._0_6_ = in_stack_fffffffffffffde8;
      vVar6._begin._7_1_ = bVar7;
      vVar6._end._0_4_ = (int)pvVar15;
      vVar6._end._4_4_ = (int)((ulong)pvVar15 >> 0x20);
      vVar6.end_array = (char *)ec;
      vVar6.erase_count = (size_t)ec_seq;
      (*p_Var5)(iVar2,(string)*pvVar1,vVar6);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      if (local_1f8 != local_1e8) {
        operator_delete(local_1f8);
      }
    }
    CB::print_update(all,(bool)(bVar7 ^ 1),ec,ec_seq,true);
  }
  return;
}

Assistant:

void output_example(vw& all, cb_adf& c, example& ec, multi_ex* ec_seq)
{
  if (example_is_newline_not_header(ec))
    return;

  bool labeled_example = update_statistics(all, c, ec, ec_seq);

  uint32_t action = ec.pred.a_s[0].action;
  for (int sink : all.final_prediction_sink) all.print(sink, (float)action, 0, ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    v_array<CB::cb_class> costs = ec.l.cb.costs;

    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].action << ':' << costs[i].partial_prediction;
    }
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  CB::print_update(all, !labeled_example, ec, ec_seq, true);
}